

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O0

void encrypt_cpa(uint8_t *out,public_key *pub,uint8_t *message,uint8_t *randomness)

{
  undefined1 local_1858 [8];
  scalar expanded_message;
  scalar v;
  vector u;
  scalar scalar_error;
  uint8_t input [33];
  undefined1 local_c2a [8];
  vector error;
  vector secret;
  uint8_t counter;
  uint8_t *randomness_local;
  uint8_t *message_local;
  public_key *pub_local;
  uint8_t *out_local;
  
  secret.v[2].c[0xfc]._1_1_ = 0;
  unique0x1000056a = randomness;
  vector_generate_secret_eta_2
            ((vector *)(error.v[2].c + 0xfc),(uint8_t *)((long)secret.v[2].c + 0x1f9),randomness);
  vector_ntt((vector *)(error.v[2].c + 0xfc));
  vector_generate_secret_eta_2
            ((vector *)local_c2a,(uint8_t *)((long)secret.v[2].c + 0x1f9),stack0xffffffffffffffd8);
  OPENSSL_memcpy(scalar_error.c + 0xfc,stack0xffffffffffffffd8,0x20);
  scalar_centered_binomial_distribution_eta_2_with_prf
            ((scalar *)(u.v[2].c + 0xfc),(uint8_t *)(scalar_error.c + 0xfc));
  matrix_mult((vector *)(v.c + 0xfc),&pub->m,(vector *)(error.v[2].c + 0xfc));
  vector_inverse_ntt((vector *)(v.c + 0xfc));
  vector_add((vector *)(v.c + 0xfc),(vector *)local_c2a);
  scalar_inner_product
            ((scalar *)(expanded_message.c + 0xfc),&pub->t,(vector *)(error.v[2].c + 0xfc));
  scalar_inverse_ntt((scalar *)(expanded_message.c + 0xfc));
  scalar_add((scalar *)(expanded_message.c + 0xfc),(scalar *)(u.v[2].c + 0xfc));
  scalar_decode_1((scalar *)local_1858,message);
  scalar_decompress((scalar *)local_1858,1);
  scalar_add((scalar *)(expanded_message.c + 0xfc),(scalar *)local_1858);
  vector_compress((vector *)(v.c + 0xfc),10);
  vector_encode(out,(vector *)(v.c + 0xfc),10);
  scalar_compress((scalar *)(expanded_message.c + 0xfc),4);
  scalar_encode(out + 0x3c0,(scalar *)(expanded_message.c + 0xfc),4);
  return;
}

Assistant:

static void encrypt_cpa(uint8_t out[KYBER_CIPHERTEXT_BYTES],
                        const struct public_key *pub, const uint8_t message[32],
                        const uint8_t randomness[32]) {
  uint8_t counter = 0;
  vector secret;
  vector_generate_secret_eta_2(&secret, &counter, randomness);
  vector_ntt(&secret);
  vector error;
  vector_generate_secret_eta_2(&error, &counter, randomness);
  uint8_t input[33];
  OPENSSL_memcpy(input, randomness, 32);
  input[32] = counter;
  scalar scalar_error;
  scalar_centered_binomial_distribution_eta_2_with_prf(&scalar_error, input);
  vector u;
  matrix_mult(&u, &pub->m, &secret);
  vector_inverse_ntt(&u);
  vector_add(&u, &error);
  scalar v;
  scalar_inner_product(&v, &pub->t, &secret);
  scalar_inverse_ntt(&v);
  scalar_add(&v, &scalar_error);
  scalar expanded_message;
  scalar_decode_1(&expanded_message, message);
  scalar_decompress(&expanded_message, 1);
  scalar_add(&v, &expanded_message);
  vector_compress(&u, kDU);
  vector_encode(out, &u, kDU);
  scalar_compress(&v, kDV);
  scalar_encode(out + kCompressedVectorSize, &v, kDV);
}